

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O2

BOOL PAL_HasEntered(void)

{
  CPalThread *pCVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    pCVar1 = CorUnix::InternalGetCurrentThread();
    if (pCVar1 == (CPalThread *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_HasEntered",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0xc4);
      fprintf(_stderr,"PAL_Reenter called on a thread unknown to this PAL\n");
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)pCVar1->m_fInPal;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
PAL_HasEntered()
{
    ENTRY_EXTERNAL("PAL_HasEntered()\n");

    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread == NULL)
    {
        ASSERT("PAL_Reenter called on a thread unknown to this PAL\n");
    }

    LOGEXIT("PAL_HasEntered returned\n");

    return pThread->IsInPal();
}